

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

CppStringType __thiscall google::protobuf::FieldDescriptor::cpp_string_type(FieldDescriptor *this)

{
  bool bVar1;
  ConstType pCVar2;
  undefined8 uVar3;
  CppStringType CVar4;
  char *pcVar5;
  undefined8 uStack_30;
  LogMessageFatal local_20 [16];
  
  if ((this->type_ != '\t') && (this->type_ != '\f')) {
    pcVar5 = "cpp_type() == FieldDescriptor::CPPTYPE_STRING";
    uStack_30 = 0x2d;
    uVar3 = 0xf79;
LAB_001c379d:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,uVar3,uStack_30,pcVar5);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
  }
  pCVar2 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (this->merged_features_,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)&pb::cpp);
  CVar4 = (pCVar2->field_0)._impl_.string_type_;
  if ((CVar4 != kView) && (CVar4 != kString)) {
    if (CVar4 == kCord) {
      CVar4 = kString;
      if (this->type_ == '\f') {
        bVar1 = is_repeated(this);
        if (!bVar1) {
          CVar4 = kString - ((this->field_0x1 & 8) == 0);
        }
      }
    }
    else {
      pCVar2 = FeatureSet::
               GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                         (this->merged_features_,
                          (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                           *)&pb::cpp);
      if ((undefined1  [16])((undefined1  [16])pCVar2->field_0 & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pcVar5 = "!features().GetExtension(pb::cpp).has_string_type()";
        uStack_30 = 0x33;
        uVar3 = 0xf8a;
        goto LAB_001c379d;
      }
      CVar4 = kString;
    }
  }
  return CVar4;
}

Assistant:

FieldDescriptor::CppStringType FieldDescriptor::cpp_string_type() const {
  ABSL_DCHECK(cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  switch (features().GetExtension(pb::cpp).string_type()) {
    case pb::CppFeatures::VIEW:
      return CppStringType::kView;
    case pb::CppFeatures::CORD:
      // In open-source, protobuf CORD is only supported for singular bytes
      // fields.
      if (type() != FieldDescriptor::TYPE_BYTES || is_repeated() ||
          is_extension()) {
        return CppStringType::kString;
      }
      return CppStringType::kCord;
    case pb::CppFeatures::STRING:
      return CppStringType::kString;
    default:
      // If features haven't been resolved, this is a dynamic build not for C++
      // codegen.  Just use string type.
      ABSL_DCHECK(!features().GetExtension(pb::cpp).has_string_type());
      return CppStringType::kString;
  }
}